

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *guid;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  char cVar27;
  byte bVar28;
  int iVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  char cVar33;
  undefined4 uVar34;
  long lVar35;
  char *pcVar36;
  char *pcVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  anon_struct_16_2_6ab6935c fields [22];
  char *local_1a8;
  undefined8 uStack_1a0;
  char *local_198 [3];
  _GLFWmapelement *local_180;
  char *local_178;
  _GLFWmapelement *local_170;
  char *local_168;
  _GLFWmapelement *local_160;
  char *local_158;
  _GLFWmapelement *local_150;
  char *local_148;
  _GLFWmapelement *local_140;
  char *local_138;
  _GLFWmapelement *local_130;
  char *local_128;
  _GLFWmapelement *local_120;
  char *local_118;
  _GLFWmapelement *local_110;
  char *local_108;
  _GLFWmapelement *local_100;
  char *local_f8;
  _GLFWmapelement *local_f0;
  char *local_e8;
  _GLFWmapelement *local_e0;
  char *local_d8;
  _GLFWmapelement *local_d0;
  char *local_c8;
  _GLFWmapelement *local_c0;
  char *local_b8;
  _GLFWmapelement *local_b0;
  char *local_a8;
  _GLFWmapelement *local_a0;
  char *local_98;
  _GLFWmapelement *local_90;
  char *local_88;
  _GLFWmapelement *local_80;
  char *local_78;
  _GLFWmapelement *local_70;
  char *local_68;
  _GLFWmapelement *local_60;
  char *local_58;
  _GLFWmapelement *local_50;
  char *local_48;
  _GLFWmapelement *local_40;
  
  local_198[0] = "platform";
  local_198[1] = (char *)0x0;
  local_198[2] = "a";
  local_180 = mapping->buttons;
  local_178 = "b";
  local_170 = mapping->buttons + 1;
  local_168 = "x";
  local_160 = mapping->buttons + 2;
  local_158 = "y";
  local_150 = mapping->buttons + 3;
  local_148 = "back";
  local_140 = mapping->buttons + 6;
  local_138 = "start";
  local_130 = mapping->buttons + 7;
  local_128 = "guide";
  local_120 = mapping->buttons + 8;
  local_118 = "leftshoulder";
  local_110 = mapping->buttons + 4;
  local_108 = "rightshoulder";
  local_100 = mapping->buttons + 5;
  local_f8 = "leftstick";
  local_f0 = mapping->buttons + 9;
  local_e8 = "rightstick";
  local_e0 = mapping->buttons + 10;
  local_d8 = "dpup";
  local_d0 = mapping->buttons + 0xb;
  local_c8 = "dpright";
  local_c0 = mapping->buttons + 0xc;
  local_b8 = "dpdown";
  local_b0 = mapping->buttons + 0xd;
  local_a8 = "dpleft";
  local_a0 = mapping->buttons + 0xe;
  local_98 = "lefttrigger";
  local_70 = mapping->axes;
  local_90 = mapping->axes + 4;
  local_88 = "righttrigger";
  local_80 = mapping->axes + 5;
  local_78 = "leftx";
  local_68 = "lefty";
  local_60 = mapping->axes + 1;
  local_58 = "rightx";
  local_50 = mapping->axes + 2;
  local_48 = "righty";
  local_40 = mapping->axes + 3;
  local_1a8 = string;
  sVar30 = strcspn(string,",");
  if ((sVar30 == 0x20) && (string[0x20] == ',')) {
    uVar24 = *(undefined8 *)string;
    uVar25 = *(undefined8 *)(string + 8);
    uVar26 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar26;
    *(undefined8 *)mapping->guid = uVar24;
    *(undefined8 *)(mapping->guid + 8) = uVar25;
    pcVar37 = string + 0x21;
    sVar30 = strcspn(pcVar37,",");
    if ((sVar30 < 0x80) && (pcVar37[sVar30] == ',')) {
      guid = mapping->guid;
      memcpy(mapping,pcVar37,sVar30);
      pcVar37 = pcVar37 + sVar30 + 1;
      do {
        cVar27 = *pcVar37;
        local_1a8 = pcVar37;
        if (cVar27 == '\0') {
          lVar35 = 0;
          do {
            pcVar37 = guid + lVar35;
            bVar28 = pcVar37[1];
            bVar10 = pcVar37[2];
            bVar11 = pcVar37[3];
            bVar12 = pcVar37[4];
            bVar13 = pcVar37[5];
            bVar14 = pcVar37[6];
            bVar15 = pcVar37[7];
            bVar16 = pcVar37[8];
            bVar17 = pcVar37[9];
            bVar18 = pcVar37[10];
            bVar19 = pcVar37[0xb];
            bVar20 = pcVar37[0xc];
            bVar21 = pcVar37[0xd];
            bVar22 = pcVar37[0xe];
            bVar23 = pcVar37[0xf];
            bVar38 = *pcVar37 + 0xbf;
            bVar39 = bVar28 + 0xbf;
            bVar40 = bVar10 + 0xbf;
            bVar41 = bVar11 + 0xbf;
            bVar42 = bVar12 + 0xbf;
            bVar43 = bVar13 + 0xbf;
            bVar44 = bVar14 + 0xbf;
            bVar45 = bVar15 + 0xbf;
            bVar2 = (byte)((5 < bVar38) * '\x05' | (5 >= bVar38) * bVar38) == bVar38;
            bVar3 = (byte)((5 < bVar39) * '\x05' | (5 >= bVar39) * bVar39) == bVar39;
            bVar4 = (byte)((5 < bVar40) * '\x05' | (5 >= bVar40) * bVar40) == bVar40;
            bVar5 = (byte)((5 < bVar41) * '\x05' | (5 >= bVar41) * bVar41) == bVar41;
            bVar6 = (byte)((5 < bVar42) * '\x05' | (5 >= bVar42) * bVar42) == bVar42;
            bVar7 = (byte)((5 < bVar43) * '\x05' | (5 >= bVar43) * bVar43) == bVar43;
            bVar8 = (byte)((5 < bVar44) * '\x05' | (5 >= bVar44) * bVar44) == bVar44;
            bVar9 = (byte)((5 < bVar45) * '\x05' | (5 >= bVar45) * bVar45) == bVar45;
            if (bVar2) {
              guid[lVar35] = *pcVar37 | 0x20;
            }
            if (bVar3) {
              mapping->guid[lVar35 + 1] = bVar28 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar35 + 2] = bVar10 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar35 + 3] = bVar11 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar35 + 4] = bVar12 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar35 + 5] = bVar13 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar35 + 6] = bVar14 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar35 + 7] = bVar15 | 0x20;
            }
            if (bVar2) {
              mapping->guid[lVar35 + 8] = bVar16 | 0x20;
            }
            if (bVar3) {
              mapping->guid[lVar35 + 9] = bVar17 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar35 + 10] = bVar18 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar35 + 0xb] = bVar19 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar35 + 0xc] = bVar20 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar35 + 0xd] = bVar21 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar35 + 0xe] = bVar22 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar35 + 0xf] = bVar23 | 0x20;
            }
            lVar35 = lVar35 + 0x10;
          } while (lVar35 != 0x20);
          _glfwPlatformUpdateGamepadGUID(guid);
          return 1;
        }
        if (cVar27 == '+') {
          return 0;
        }
        if (cVar27 == '-') {
          return 0;
        }
        lVar35 = 8;
        do {
          pcVar36 = *(char **)((long)&uStack_1a0 + lVar35);
          sVar30 = strlen(pcVar36);
          iVar29 = strncmp(pcVar37,pcVar36,sVar30);
          if ((iVar29 == 0) && (pcVar37[sVar30] == ':')) {
            pcVar36 = pcVar37 + sVar30 + 1;
            pcVar1 = *(char **)((long)local_198 + lVar35);
            if (pcVar1 == (char *)0x0) {
              local_1a8 = pcVar36;
              iVar29 = strncmp(pcVar36,"Linux",5);
              pcVar37 = pcVar36;
              if (iVar29 != 0) {
                return 0;
              }
              break;
            }
            cVar27 = *pcVar36;
            cVar33 = '\x01';
            if (cVar27 == '+') {
              uVar34 = 0;
              cVar33 = '\x01';
LAB_0010dfd9:
              pcVar36 = pcVar37 + sVar30 + 2;
              cVar27 = pcVar37[sVar30 + 2];
            }
            else {
              if (cVar27 == '-') {
                uVar34 = 0xffffffff;
                cVar33 = '\0';
                goto LAB_0010dfd9;
              }
              uVar34 = 0xffffffff;
            }
            local_1a8 = pcVar36;
            if (cVar27 == 'a') {
              cVar27 = '\x01';
LAB_0010e056:
              *pcVar1 = cVar27;
              uStack_1a0._4_4_ = uVar34;
              uVar32 = strtoul(pcVar36 + 1,&local_1a8,10);
              bVar28 = (byte)uVar32;
            }
            else {
              if (cVar27 != 'h') {
                pcVar37 = pcVar36;
                if (cVar27 == 'b') {
                  cVar27 = '\x02';
                  goto LAB_0010e056;
                }
                break;
              }
              *pcVar1 = '\x03';
              uStack_1a0._4_4_ = uVar34;
              uVar32 = strtoul(pcVar36 + 1,&local_1a8,10);
              uVar31 = strtoul(local_1a8 + 1,&local_1a8,10);
              bVar28 = (byte)(uVar32 << 4) | (byte)uVar31;
            }
            pcVar1[1] = bVar28;
            pcVar37 = local_1a8;
            if (*pcVar1 == '\x01') {
              bVar28 = 2 / (byte)(cVar33 - (char)uStack_1a0._4_4_);
              pcVar1[2] = bVar28;
              cVar33 = cVar33 + (char)uStack_1a0._4_4_;
              pcVar1[3] = -cVar33;
              if (*local_1a8 == '~') {
                pcVar1[2] = -bVar28;
                pcVar1[3] = cVar33;
              }
            }
            break;
          }
          lVar35 = lVar35 + 0x10;
        } while (lVar35 != 0x168);
        sVar30 = strcspn(pcVar37,",");
        pcVar37 = pcVar37 + sVar30;
        local_1a8 = pcVar37;
        sVar30 = strspn(pcVar37,",");
        pcVar37 = pcVar37 + sVar30;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}